

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O2

void Aig_ManComputeSccs(Aig_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  Vec_Int_t *pVVar4;
  Vec_Ptr_t *p_02;
  Vec_Int_t *pVVar5;
  void *__ptr;
  ulong uVar6;
  int i;
  int iVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  
  if (p->nRegs == 0) {
    puts("The network is combinational.");
    return;
  }
  p_00 = Aig_ManSupports(p);
  iVar10 = p->nRegs;
  p_01 = Vec_PtrAlloc(iVar10);
  p_01->nSize = iVar10;
  memset(p_01->pArray,0,(long)iVar10 << 3);
  for (iVar7 = 0; iVar7 < p_00->nSize; iVar7 = iVar7 + 1) {
    pVVar4 = (Vec_Int_t *)Vec_PtrEntry(p_00,iVar7);
    if (pVVar4->nSize < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
    }
    uVar1 = pVVar4->nSize - 1;
    uVar8 = (ulong)uVar1;
    pVVar4->nSize = uVar1;
    iVar9 = (p->nRegs - p->nObjs[3]) + pVVar4->pArray[uVar8];
    if (-1 < iVar9) {
      iVar3 = 0;
      for (i = 0; i < (int)uVar8; i = i + 1) {
        iVar2 = Vec_IntEntry(pVVar4,i);
        iVar2 = (p->nRegs - p->nObjs[2]) + iVar2;
        if (-1 < iVar2) {
          if (p->nRegs <= iVar2) {
            __assert_fail("iIn < Aig_ManRegNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigScl.c"
                          ,0x206,"void Aig_ManComputeSccs(Aig_Man_t *)");
          }
          Vec_IntWriteEntry(pVVar4,iVar3,iVar2);
          iVar3 = iVar3 + 1;
        }
        uVar8 = (ulong)(uint)pVVar4->nSize;
      }
      Vec_IntShrink(pVVar4,iVar3);
      if (p->nRegs <= iVar9) {
        __assert_fail("iOut < Aig_ManRegNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigScl.c"
                      ,0x20b,"void Aig_ManComputeSccs(Aig_Man_t *)");
      }
      Vec_PtrWriteEntry(p_01,iVar9,pVVar4);
    }
  }
  p_02 = Vec_PtrAlloc(p->nRegs);
  for (iVar7 = 0; iVar7 < p->nRegs; iVar7 = iVar7 + 1) {
    pVVar4 = Vec_IntAlloc(8);
    Vec_PtrPush(p_02,pVVar4);
  }
  iVar7 = 0;
  iVar9 = 0;
  if (0 < iVar10) {
    iVar7 = 0;
    iVar9 = iVar10;
  }
  for (; iVar7 != iVar9; iVar7 = iVar7 + 1) {
    pVVar4 = (Vec_Int_t *)Vec_PtrEntry(p_01,iVar7);
    for (iVar10 = 0; iVar10 < pVVar4->nSize; iVar10 = iVar10 + 1) {
      iVar3 = Vec_IntEntry(pVVar4,iVar10);
      pVVar5 = (Vec_Int_t *)Vec_PtrEntry(p_02,iVar3);
      Vec_IntPush(pVVar5,iVar7);
    }
  }
  pVVar4 = Vec_IntAlloc(p->nRegs);
  uVar1 = p->nRegs;
  __ptr = calloc(1,(long)(int)uVar1);
  uVar11 = 0;
  do {
    pVVar4->nSize = 0;
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = (ulong)uVar1;
    }
    for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      if (*(char *)((long)__ptr + uVar6) == '\0') {
        uVar8 = uVar6 & 0xffffffff;
        break;
      }
    }
    if ((uint)uVar8 == uVar1) goto LAB_00580e19;
    *(undefined1 *)((long)__ptr + uVar8) = 1;
    Vec_IntPush(pVVar4,(uint)uVar8);
    iVar10 = 0;
    while( true ) {
      if (pVVar4->nSize <= iVar10) break;
      iVar7 = Vec_IntEntry(pVVar4,iVar10);
      pVVar5 = (Vec_Int_t *)Vec_PtrEntry(p_01,iVar7);
      for (iVar9 = 0; iVar9 < pVVar5->nSize; iVar9 = iVar9 + 1) {
        iVar3 = Vec_IntEntry(pVVar5,iVar9);
        if (*(char *)((long)__ptr + (long)iVar3) == '\0') {
          *(undefined1 *)((long)__ptr + (long)iVar3) = 1;
          Vec_IntPush(pVVar4,iVar3);
        }
      }
      pVVar5 = (Vec_Int_t *)Vec_PtrEntry(p_02,iVar7);
      for (iVar7 = 0; iVar7 < pVVar5->nSize; iVar7 = iVar7 + 1) {
        iVar9 = Vec_IntEntry(pVVar5,iVar7);
        if (*(char *)((long)__ptr + (long)iVar9) == '\0') {
          *(undefined1 *)((long)__ptr + (long)iVar9) = 1;
          Vec_IntPush(pVVar4,iVar9);
        }
      }
      iVar10 = iVar10 + 1;
    }
    if (pVVar4->nSize == p->nRegs) {
      puts("There is only one SCC of registers in this network.");
LAB_00580e19:
      free(__ptr);
      free(pVVar4->pArray);
      free(pVVar4);
      Vec_PtrFree(p_01);
      Vec_VecFree((Vec_Vec_t *)p_02);
      Vec_VecFree((Vec_Vec_t *)p_00);
      return;
    }
    uVar11 = uVar11 + 1;
    printf("SCC #%d contains %5d registers.\n",(ulong)uVar11);
    uVar1 = p->nRegs;
  } while( true );
}

Assistant:

void Aig_ManComputeSccs( Aig_Man_t * p )
{
    Vec_Ptr_t * vSupports, * vMatrix, * vMatrix2;
    Vec_Int_t * vSupp, * vSupp2, * vComp;
    char * pVarsTot;
    int i, k, m, iOut, iIn, nComps;
    if ( Aig_ManRegNum(p) == 0 )
    {
        printf( "The network is combinational.\n" );
        return;
    }
    // get structural supports for each output
    vSupports = Aig_ManSupports( p );
    // transforms the supports into the latch dependency matrix
    vMatrix = Vec_PtrStart( Aig_ManRegNum(p) );
    Vec_PtrForEachEntry( Vec_Int_t *, vSupports, vSupp, i )
    {
        // skip true POs
        iOut = Vec_IntPop( vSupp );
        iOut -= Aig_ManCoNum(p) - Aig_ManRegNum(p);
        if ( iOut < 0 )
            continue;
        // remove PIs
        m = 0;
        Vec_IntForEachEntry( vSupp, iIn, k )
        {
            iIn -= Aig_ManCiNum(p) - Aig_ManRegNum(p);
            if ( iIn < 0 )
                continue;
            assert( iIn < Aig_ManRegNum(p) );
            Vec_IntWriteEntry( vSupp, m++, iIn );
        }
        Vec_IntShrink( vSupp, m );
        // store support in the matrix
        assert( iOut < Aig_ManRegNum(p) );
        Vec_PtrWriteEntry( vMatrix, iOut, vSupp );
    }
    // create the reverse matrix
    vMatrix2 = Vec_PtrAlloc( Aig_ManRegNum(p) );
    for ( i = 0; i < Aig_ManRegNum(p); i++ )
        Vec_PtrPush( vMatrix2, Vec_IntAlloc(8) );
    Vec_PtrForEachEntry( Vec_Int_t *, vMatrix, vSupp, i )
    {
        Vec_IntForEachEntry( vSupp, iIn, k )
        {
            vSupp2 = (Vec_Int_t *)Vec_PtrEntry( vMatrix2, iIn );
            Vec_IntPush( vSupp2, i );
        }
    } 

    // detect strongly connected components
    vComp = Vec_IntAlloc( Aig_ManRegNum(p) );
    pVarsTot = ABC_ALLOC( char, Aig_ManRegNum(p) );
    memset( pVarsTot, 0, Aig_ManRegNum(p) * sizeof(char) );
    for ( nComps = 0; ; nComps++ )
    {
        Vec_IntClear( vComp );
        // get the first support
        for ( iOut = 0; iOut < Aig_ManRegNum(p); iOut++ )
            if ( pVarsTot[iOut] == 0 )
                break;
        if ( iOut == Aig_ManRegNum(p) )
            break;
        pVarsTot[iOut] = 1;
        Vec_IntPush( vComp, iOut );
        Vec_IntForEachEntry( vComp, iOut, i )
        {
            vSupp = (Vec_Int_t *)Vec_PtrEntry( vMatrix, iOut );
            Vec_IntForEachEntry( vSupp, iIn, k )
            {
                if ( pVarsTot[iIn] )
                    continue;
                pVarsTot[iIn] = 1;
                Vec_IntPush( vComp, iIn );
            }
            vSupp2 = (Vec_Int_t *)Vec_PtrEntry( vMatrix2, iOut );
            Vec_IntForEachEntry( vSupp2, iIn, k )
            {
                if ( pVarsTot[iIn] )
                    continue;
                pVarsTot[iIn] = 1;
                Vec_IntPush( vComp, iIn );
            }
        }
        if ( Vec_IntSize(vComp) == Aig_ManRegNum(p) )
        {
            printf( "There is only one SCC of registers in this network.\n" );
            break;
        }
        printf( "SCC #%d contains %5d registers.\n", nComps+1, Vec_IntSize(vComp) );
    }
    ABC_FREE( pVarsTot );
    Vec_IntFree( vComp );
    Vec_PtrFree( vMatrix );
    Vec_VecFree( (Vec_Vec_t *)vMatrix2 );
    Vec_VecFree( (Vec_Vec_t *)vSupports );
}